

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crunch.cpp
# Opt level: O2

convert_status __thiscall
crunch::convert_file
          (crunch *this,uint32 file_index,uint32 num_files,char *pSrc_filename,char *pDst_filename,
          format out_file_type)

{
  command_line_params *this_00;
  bool bVar1;
  format file_format;
  uint uVar2;
  pixel_format fmt;
  char *pcVar3;
  convert_status cVar4;
  uint32 i;
  uint index;
  timer tim;
  mipmapped_texture src_tex;
  convert_stats stats;
  convert_params params;
  
  crnlib::timer::timer(&tim);
  if (num_files < 2) {
    crnlib::console::message("Reading source texture: \"%s\"",pSrc_filename);
  }
  else {
    crnlib::console::message
              ("[%u/%u] Reading source texture: \"%s\"",(ulong)(file_index + 1),(ulong)num_files);
  }
  file_format = crnlib::texture_file_types::determine_file_format(pSrc_filename);
  if (file_format == cFormatInvalid) {
    cVar4 = cCSFailed;
    crnlib::console::error("Unrecognized file type: %s",pSrc_filename);
  }
  else {
    crnlib::mipmapped_texture::mipmapped_texture(&src_tex);
    crnlib::timer::start(&tim);
    bVar1 = crnlib::mipmapped_texture::read_from_file(&src_tex,pSrc_filename,file_format);
    if (bVar1) {
      crnlib::timer::get_elapsed_secs(&tim);
      crnlib::console::info("Texture successfully loaded in %3.3fs");
      this_00 = &this->m_params;
      bVar1 = crnlib::command_line_params::get_value_as_bool(this_00,"converttoluma",0,false);
      if (bVar1) {
        crnlib::mipmapped_texture::convert(&src_tex,cConversion_Y_To_RGB);
      }
      bVar1 = crnlib::command_line_params::get_value_as_bool(this_00,"setalphatoluma",0,false);
      if (bVar1) {
        crnlib::mipmapped_texture::convert(&src_tex,cConversion_Y_To_A);
      }
      crnlib::texture_conversion::convert_params::convert_params(&params);
      params.m_texture_type = crnlib::mipmapped_texture::determine_texture_type(&src_tex);
      params.m_pInput_texture = &src_tex;
      crnlib::dynamic_string::operator=(&params.m_dst_filename,pDst_filename);
      params.m_dst_file_type = out_file_type;
      params.m_lzma_stats = crnlib::command_line_params::has_key(this_00,"lzmastats");
      params.m_write_mipmaps_to_multiple_files =
           crnlib::command_line_params::has_key(this_00,"split");
      params.m_always_use_source_pixel_format =
           crnlib::command_line_params::has_key(this_00,"usesourceformat");
      params.m_y_flip = crnlib::command_line_params::has_key(this_00,"yflip");
      params.m_unflip = crnlib::command_line_params::has_key(this_00,"unflip");
      bVar1 = crnlib::command_line_params::get_value_as_bool(this_00,"noprogress",0,false);
      if ((!bVar1) &&
         (bVar1 = crnlib::command_line_params::get_value_as_bool(this_00,"quiet",0,false), !bVar1))
      {
        params.m_pProgress_func = progress_callback_func;
      }
      bVar1 = crnlib::command_line_params::get_value_as_bool(this_00,"debug",0,false);
      if (bVar1) {
        params.m_debugging = true;
        params.m_comp_params.m_flags._3_1_ = params.m_comp_params.m_flags._3_1_ | 0x80;
      }
      bVar1 = crnlib::command_line_params::get_value_as_bool(this_00,"paramdebug",0,false);
      if (bVar1) {
        params.m_param_debugging = true;
      }
      bVar1 = crnlib::command_line_params::get_value_as_bool(this_00,"quick",0,false);
      if (bVar1) {
        params.m_quick = true;
      }
      index = 0;
      params.m_no_stats = crnlib::command_line_params::get_value_as_bool(this_00,"nostats",0,false);
      params.m_dst_format = PIXEL_FMT_INVALID;
      do {
        uVar2 = crnlib::pixel_format_helpers::get_num_formats();
        fmt = params.m_dst_format;
        if (uVar2 <= index) break;
        fmt = crnlib::pixel_format_helpers::get_pixel_format_by_index(index);
        pcVar3 = crnlib::pixel_format_helpers::get_pixel_format_string(fmt);
        bVar1 = crnlib::command_line_params::has_key(this_00,pcVar3);
        index = index + 1;
      } while (!bVar1);
      params.m_dst_format = fmt;
      bVar1 = crnlib::texture_file_types::supports_mipmaps(file_format);
      if (bVar1) {
        params.m_mipmap_params.m_mode = cCRNMipModeUseSourceMips;
      }
      bVar1 = parse_mipmap_params(this,&params.m_mipmap_params);
      cVar4 = cCSBadParam;
      if (((bVar1) &&
          (bVar1 = parse_comp_params(this,params.m_dst_file_type,&params.m_comp_params), bVar1)) &&
         (bVar1 = parse_scale_params(this,&params.m_mipmap_params), bVar1)) {
        print_texture_info(this,"Source texture",&params,&src_tex);
        if (params.m_texture_type == cTextureTypeNormalMap) {
          params.m_comp_params.m_flags._0_1_ = (byte)params.m_comp_params.m_flags & 0xfe;
        }
        crnlib::texture_conversion::convert_stats::convert_stats(&stats);
        crnlib::timer::start(&tim);
        bVar1 = crnlib::texture_conversion::process(&params,&stats);
        crnlib::timer::get_elapsed_secs(&tim);
        if (bVar1) {
          crnlib::console::info("Texture successfully processed in %3.3fs");
          bVar1 = crnlib::command_line_params::get_value_as_bool(this_00,"nostats",0,false);
          cVar4 = cCSSucceeded;
          if (!bVar1) {
            print_stats(this,&stats,false);
          }
        }
        else if (params.m_error_message.m_len == 0) {
          cVar4 = cCSFailed;
          crnlib::console::error("Failed writing output file: \"%s\"",pDst_filename);
        }
        else {
          pcVar3 = "";
          if (params.m_error_message.m_pStr != (char *)0x0) {
            pcVar3 = params.m_error_message.m_pStr;
          }
          cVar4 = cCSFailed;
          crnlib::console::error(pcVar3);
        }
        crnlib::texture_conversion::convert_stats::~convert_stats(&stats);
      }
      crnlib::texture_conversion::convert_params::~convert_params(&params);
    }
    else if (src_tex.m_last_error.m_len == 0) {
      cVar4 = cCSFailed;
      crnlib::console::error("Failed reading source file: \"%s\"",pSrc_filename);
    }
    else {
      pcVar3 = "";
      if (src_tex.m_last_error.m_pStr != (char *)0x0) {
        pcVar3 = src_tex.m_last_error.m_pStr;
      }
      cVar4 = cCSFailed;
      crnlib::console::error("%s",pcVar3);
    }
    crnlib::mipmapped_texture::~mipmapped_texture(&src_tex);
  }
  return cVar4;
}

Assistant:

convert_status convert_file(uint32 file_index, uint32 num_files, const char* pSrc_filename, const char* pDst_filename, texture_file_types::format out_file_type)
    {
        timer tim;

        if (num_files > 1)
        {
            console::message("[%u/%u] Reading source texture: \"%s\"", file_index + 1, num_files, pSrc_filename);
        }
        else
        {
            console::message("Reading source texture: \"%s\"", pSrc_filename);
        }

        texture_file_types::format src_file_format = texture_file_types::determine_file_format(pSrc_filename);
        if (src_file_format == texture_file_types::cFormatInvalid)
        {
            console::error("Unrecognized file type: %s", pSrc_filename);
            return cCSFailed;
        }

        mipmapped_texture src_tex;
        tim.start();
        if (!src_tex.read_from_file(pSrc_filename, src_file_format))
        {
            if (src_tex.get_last_error().is_empty())
            {
                console::error("Failed reading source file: \"%s\"", pSrc_filename);
            }
            else
            {
                console::error("%s", src_tex.get_last_error().get_ptr());
            }

            return cCSFailed;
        }
        double total_time = tim.get_elapsed_secs();
        console::info("Texture successfully loaded in %3.3fs", total_time);

        if (m_params.get_value_as_bool("converttoluma"))
        {
            src_tex.convert(image_utils::cConversion_Y_To_RGB);
        }
        if (m_params.get_value_as_bool("setalphatoluma"))
        {
            src_tex.convert(image_utils::cConversion_Y_To_A);
        }

        texture_conversion::convert_params params;

        params.m_texture_type = src_tex.determine_texture_type();
        params.m_pInput_texture = &src_tex;
        params.m_dst_filename = pDst_filename;
        params.m_dst_file_type = out_file_type;
        params.m_lzma_stats = m_params.has_key("lzmastats");
        params.m_write_mipmaps_to_multiple_files = m_params.has_key("split");
        params.m_always_use_source_pixel_format = m_params.has_key("usesourceformat");
        params.m_y_flip = m_params.has_key("yflip");
        params.m_unflip = m_params.has_key("unflip");

        if ((!m_params.get_value_as_bool("noprogress")) && (!m_params.get_value_as_bool("quiet")))
        {
            params.m_pProgress_func = progress_callback_func;
        }

        if (m_params.get_value_as_bool("debug"))
        {
            params.m_debugging = true;
            params.m_comp_params.set_flag(cCRNCompFlagDebugging, true);
        }

        if (m_params.get_value_as_bool("paramdebug"))
        {
            params.m_param_debugging = true;
        }

        if (m_params.get_value_as_bool("quick"))
        {
            params.m_quick = true;
        }

        params.m_no_stats = m_params.get_value_as_bool("nostats");

        params.m_dst_format = PIXEL_FMT_INVALID;

        for (uint32 i = 0; i < pixel_format_helpers::get_num_formats(); i++)
        {
            pixel_format trial_fmt = pixel_format_helpers::get_pixel_format_by_index(i);
            if (m_params.has_key(pixel_format_helpers::get_pixel_format_string(trial_fmt)))
            {
                params.m_dst_format = trial_fmt;
                break;
            }
        }

        if (texture_file_types::supports_mipmaps(src_file_format))
        {
            params.m_mipmap_params.m_mode = cCRNMipModeUseSourceMips;
        }

        if (!parse_mipmap_params(params.m_mipmap_params))
        {
            return cCSBadParam;
        }

        if (!parse_comp_params(params.m_dst_file_type, params.m_comp_params))
        {
            return cCSBadParam;
        }

        if (!parse_scale_params(params.m_mipmap_params))
        {
            return cCSBadParam;
        }

        print_texture_info("Source texture", params, src_tex);

        if (params.m_texture_type == cTextureTypeNormalMap)
        {
            params.m_comp_params.set_flag(cCRNCompFlagPerceptual, false);
        }

        texture_conversion::convert_stats stats;

        tim.start();
        bool status = texture_conversion::process(params, stats);
        total_time = tim.get_elapsed_secs();

        if (!status)
        {
            if (params.m_error_message.is_empty())
            {
                console::error("Failed writing output file: \"%s\"", pDst_filename);
            }
            else
            {
                console::error(params.m_error_message.get_ptr());
            }
            return cCSFailed;
        }

        console::info("Texture successfully processed in %3.3fs", total_time);

        if (!m_params.get_value_as_bool("nostats"))
        {
            print_stats(stats);
        }

        return cCSSucceeded;
    }